

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

string * phosg::load_file(string *__return_storage_ptr__,string *filename)

{
  uint uVar1;
  int __fd;
  char *pcVar2;
  size_type __nbytes;
  int *piVar3;
  runtime_error *prVar4;
  uint *puVar5;
  int error;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f1;
  string local_f0;
  size_type local_d0;
  ssize_t bytes_read;
  undefined1 local_b8 [48];
  size_type local_88;
  size_type local_28;
  ssize_t file_size;
  string *psStack_18;
  scoped_fd fd;
  string *filename_local;
  string *data;
  
  psStack_18 = filename;
  scoped_fd::scoped_fd((scoped_fd *)((long)&file_size + 4),filename,0,0x1ed);
  uVar1 = scoped_fd::operator_cast_to_int((scoped_fd *)((long)&file_size + 4));
  fstat((int)local_b8,(stat *)(ulong)uVar1);
  local_28 = local_88;
  bytes_read._3_1_ = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_88,'\0',
             (allocator<char> *)((long)&bytes_read + 2));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&bytes_read + 2));
  __fd = scoped_fd::operator_cast_to_int((scoped_fd *)((long)&file_size + 4));
  pcVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__);
  __nbytes = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__);
  local_d0 = ::read(__fd,pcVar2,__nbytes);
  if (local_d0 == local_28) {
    bytes_read._3_1_ = 1;
    scoped_fd::~scoped_fd((scoped_fd *)((long)&file_size + 4));
    return __return_storage_ptr__;
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_158,"can\'t read from ",psStack_18);
    ::std::operator+(&local_138,&local_158,": ");
    puVar5 = (uint *)__errno_location();
    string_for_error_abi_cxx11_(&local_178,(phosg *)(ulong)*puVar5,error);
    ::std::operator+(&local_118,&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178
                    );
    ::std::runtime_error::runtime_error(prVar4,(string *)&local_118);
    __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_f1 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      psStack_18);
  string_printf_abi_cxx11_
            (&local_f0,"can\'t read from %s: %zd/%zd bytes read",pcVar2,local_d0,local_28);
  ::std::runtime_error::runtime_error(prVar4,(string *)&local_f0);
  local_f1 = 0;
  __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string load_file(const string& filename) {
  scoped_fd fd(filename, O_RDONLY);
  ssize_t file_size = fstat(fd).st_size;

  string data(file_size, 0);
  ssize_t bytes_read = ::read(fd, data.data(), data.size());
  if (bytes_read != file_size) {
    if (errno == 0) {
      throw runtime_error(string_printf("can\'t read from %s: %zd/%zd bytes read",
          filename.c_str(), bytes_read, file_size));
    } else {
      throw runtime_error("can\'t read from " + filename + ": " + string_for_error(errno));
    }
  }

  return data;
}